

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Reg3(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ProfileId local_26;
  OpLayoutType local_24;
  bool success;
  bool isProfiled;
  ProfileId profileId;
  RegSlot local_1c;
  RegSlot R2_local;
  RegSlot R1_local;
  RegSlot R0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  _success = R2;
  local_1c = R1;
  R2_local = R0;
  R1_local._2_2_ = op;
  _R0_local = this;
  CheckOpen(this);
  op_00 = R1_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,Reg3);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(R1_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x1b2,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  R2_local = ConsumeReg(this,R2_local);
  local_1c = ConsumeReg(this,local_1c);
  _success = ConsumeReg(this,_success);
  local_26 = 0;
  bVar2 = false;
  bVar3 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false);
  if ((bVar3) &&
     (((R1_local._2_2_ == Div_A || (R1_local._2_2_ == Rem_A)) &&
      (bVar3 = FunctionBody::AllocProfiledDivOrRem(this->m_functionWrite,&local_26), bVar3)))) {
    bVar2 = true;
    OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&R1_local + 2));
  }
  else if ((R1_local._2_2_ == IsIn) &&
          (bVar3 = FunctionBody::AllocProfiledLdElemId(this->m_functionWrite,&local_26), bVar3)) {
    bVar2 = true;
    OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&R1_local + 2));
  }
  bVar3 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,R1_local._2_2_,R2_local,local_1c,_success);
  if (((!bVar3) &&
      (bVar3 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,R1_local._2_2_,R2_local,local_1c,_success), !bVar3)) &&
     (bVar3 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,R1_local._2_2_,R2_local,local_1c,_success), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x1c6,"(success)","success");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (bVar2) {
    Data::Encode(&this->m_byteCodeData,&local_26,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::Reg3(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        ProfileId profileId = 0;
        bool isProfiled = false;
        if ((DoDynamicProfileOpcode(FloatTypeSpecPhase) && (op == Js::OpCode::Div_A || op == Js::OpCode::Rem_A)) &&
            this->m_functionWrite->AllocProfiledDivOrRem(&profileId))
        {
            isProfiled = true;
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }
        else if (op == Js::OpCode::IsIn && this->m_functionWrite->AllocProfiledLdElemId(&profileId))
        {
            isProfiled = true;
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }

        MULTISIZE_LAYOUT_WRITE(Reg3, op, R0, R1, R2);
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }